

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O0

string_view bloaty::dwarf::ReadDebugStrEntry(string_view section,size_t ofs)

{
  string_view *in_RDX;
  size_t in_RDI;
  string_view sVar1;
  
  SkipBytes(in_RDI,in_RDX);
  sVar1 = ReadNullTerminated((string_view *)0x213691);
  return sVar1;
}

Assistant:

std::string_view ReadDebugStrEntry(std::string_view section, size_t ofs) {
  SkipBytes(ofs, &section);
  return ReadNullTerminated(&section);
}